

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsMan.c
# Opt level: O0

Mfs_Man_t * Mfs_ManAlloc(Mfs_Par_t *pPars)

{
  int iVar1;
  Mfs_Man_t *__s;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  Int_Man_t *pIVar4;
  Vec_Vec_t *pVVar5;
  Mfs_Man_t *p;
  Mfs_Par_t *pPars_local;
  
  __s = (Mfs_Man_t *)malloc(0x388);
  memset(__s,0,0x388);
  __s->pPars = pPars;
  pVVar2 = Vec_IntAlloc(100);
  __s->vProjVarsCnf = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  __s->vProjVarsSat = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  __s->vDivLits = pVVar2;
  iVar1 = Abc_BitWordNum(__s->pPars->nWinMax + 0xc);
  __s->nDivWords = iVar1;
  pVVar3 = Vec_PtrAllocSimInfo(__s->pPars->nWinMax + 0xd,__s->nDivWords);
  __s->vDivCexes = pVVar3;
  pIVar4 = Int_ManAlloc();
  __s->pMan = pIVar4;
  pVVar2 = Vec_IntAlloc(0);
  __s->vMem = pVVar2;
  pVVar5 = Vec_VecStart(0x20);
  __s->vLevels = pVVar5;
  pVVar3 = Vec_PtrAlloc(0x20);
  __s->vMfsFanins = pVVar3;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mfs_Man_t * Mfs_ManAlloc( Mfs_Par_t * pPars )
{
    Mfs_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Mfs_Man_t, 1 );
    memset( p, 0, sizeof(Mfs_Man_t) );
    p->pPars     = pPars;
    p->vProjVarsCnf = Vec_IntAlloc( 100 );
    p->vProjVarsSat = Vec_IntAlloc( 100 );
    p->vDivLits  = Vec_IntAlloc( 100 );
    p->nDivWords = Abc_BitWordNum(p->pPars->nWinMax + MFS_FANIN_MAX);
    p->vDivCexes = Vec_PtrAllocSimInfo( p->pPars->nWinMax + MFS_FANIN_MAX + 1, p->nDivWords );
    p->pMan      = Int_ManAlloc();
    p->vMem      = Vec_IntAlloc( 0 );
    p->vLevels   = Vec_VecStart( 32 );
    p->vMfsFanins= Vec_PtrAlloc( 32 );
    return p;
}